

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

HANDLE OpenFileMappingA(DWORD dwDesiredAccess,BOOL bInheritHandle,LPCSTR lpName)

{
  bool bVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  
  if (PAL_InitializeChakraCoreCalled) {
    pvVar2 = pthread_getspecific(CorUnix::thObjKey);
    if (pvVar2 == (void *)0x0) {
      CreateCurrentThreadData();
    }
    if (lpName == (LPCSTR)0x0) {
      iVar4 = 0x57;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00334748;
    }
    else {
      fprintf(_stderr,"] %s %s:%d","OpenFileMappingA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
              ,0x31d);
      fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
      iVar4 = 0x32;
    }
    bVar1 = PAL_InitializeChakraCoreCalled;
    piVar3 = __errno_location();
    *piVar3 = iVar4;
    if ((bVar1 & 1U) != 0) {
      return (HANDLE)0x0;
    }
  }
LAB_00334748:
  abort();
}

Assistant:

HANDLE
PALAPI
OpenFileMappingA(
         IN DWORD dwDesiredAccess,
         IN BOOL bInheritHandle,
         IN LPCSTR lpName)
{
    HANDLE hFileMapping = NULL;
    CPalThread *pThread = NULL;
    PAL_ERROR palError = NO_ERROR;

    PERF_ENTRY(OpenFileMappingA);
    ENTRY("OpenFileMappingA(dwDesiredAccess=%u, bInheritHandle=%d, lpName=%p (%s)\n",
          dwDesiredAccess, bInheritHandle, lpName?lpName:"NULL", lpName?lpName:"NULL");

    pThread = InternalGetCurrentThread();

    if (lpName == nullptr)
    {
        ERROR("name is NULL\n");
        palError = ERROR_INVALID_PARAMETER;
    }
    else
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }
    LOGEXIT( "OpenFileMappingA returning %p\n", hFileMapping );
    PERF_EXIT(OpenFileMappingA);
    return hFileMapping;
}